

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryFunctions.cpp
# Opt level: O1

bool __thiscall
helics::waitForInit(helics *this,Federate *fed,string_view fedName,milliseconds timeout)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  int *piVar4;
  long lVar5;
  string_view target;
  string_view target_00;
  string_view queryStr;
  string_view queryStr_00;
  string res;
  string local_70;
  string local_50;
  
  target._M_str = (char *)fedName._M_len;
  target._M_len = (size_t)fed;
  queryStr._M_str = "isinit";
  queryStr._M_len = 6;
  Federate::query_abi_cxx11_
            (&local_50,(Federate *)this,target,queryStr,HELICS_SEQUENCING_MODE_ORDERED);
  lVar5 = 0;
  do {
    iVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                    "true");
    if (iVar1 == 0) break;
    sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                 "error",0,5);
    if (sVar3 != 0xffffffffffffffff) break;
    local_70._M_dataplus._M_p = (pointer)0x0;
    local_70._M_string_length = 400000000;
    do {
      iVar2 = nanosleep((timespec *)&local_70,(timespec *)&local_70);
      if (iVar2 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    target_00._M_str = (char *)fedName._M_len;
    target_00._M_len = (size_t)fed;
    queryStr_00._M_str = "isinit";
    queryStr_00._M_len = 6;
    Federate::query_abi_cxx11_
              (&local_70,(Federate *)this,target_00,queryStr_00,HELICS_SEQUENCING_MODE_ORDERED);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    lVar5 = lVar5 + 400;
  } while (lVar5 < (long)fedName._M_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return iVar1 == 0;
}

Assistant:

bool waitForInit(helics::Federate* fed, std::string_view fedName, std::chrono::milliseconds timeout)
{
    auto res = fed->query(fedName, "isinit", HELICS_SEQUENCING_MODE_ORDERED);
    std::chrono::milliseconds waitTime{0};
    const std::chrono::milliseconds delta{400};
    while (res != "true") {
        if (res.find("error") != std::string::npos) {
            return false;
        }
        std::this_thread::sleep_for(delta);
        res = fed->query(fedName, "isinit", HELICS_SEQUENCING_MODE_ORDERED);
        waitTime += delta;
        if (waitTime >= timeout) {
            return false;
        }
    }
    return true;
}